

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementAssembly::~IfcElementAssembly(IfcElementAssembly *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70 = 0x8a4c98;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x58 = 0x8a4d88;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.Representation.have = 0x8a4cc0;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.field_0x108 = 0x8a4ce8;
  *(undefined8 *)&this[-1].super_IfcElement.field_0x140 = 0x8a4d10;
  this[-1].PredefinedType._M_dataplus._M_p = (pointer)0x8a4d38;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x8a4d60;
  puVar1 = *(undefined1 **)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x38;
  if (puVar1 != &(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x48) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x10;
  if (puVar1 != &(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x20) {
    operator_delete(puVar1);
  }
  IfcElement::~IfcElement
            ((IfcElement *)&this[-1].super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70,
             &PTR_construction_vtable_24__008a4da0);
  return;
}

Assistant:

IfcElementAssembly() : Object("IfcElementAssembly") {}